

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O2

void __thiscall QRasterPaintEngine::updateBrush(QRasterPaintEngine *this,QBrush *brush)

{
  QPaintEngineState *pQVar1;
  QRasterPaintEnginePrivate *this_00;
  QRasterPaintEnginePrivate *this_01;
  TransformationType TVar2;
  QClipData *pQVar3;
  long lVar4;
  QPaintEngineState *pQVar5;
  QTransform *pQVar6;
  QTransform *pQVar7;
  long in_FS_OFFSET;
  byte bVar8;
  QTransform QStack_88;
  long local_38;
  
  bVar8 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
  this_00 = (QRasterPaintEnginePrivate *)(this->super_QPaintEngineEx).super_QPaintEngine.d_ptr.d;
  pQVar5 = pQVar1 + -2;
  if (pQVar1 == (QPaintEngineState *)0x0) {
    pQVar5 = (QPaintEngineState *)0x0;
  }
  pQVar3 = QRasterPaintEnginePrivate::clip(this_00);
  *(QClipData **)(pQVar5 + 0xda) = pQVar3;
  QSpanData::setup((QSpanData *)(pQVar5 + 0xba),brush,
                   pQVar5[0xfe].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                   super_QFlagsStorage<QPaintEngine::DirtyFlag>.i,
                   pQVar5[0x6d].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                   super_QFlagsStorage<QPaintEngine::DirtyFlag>.i,
                   (bool)(*(byte *)((long)&pQVar5[0x105].dirtyFlags.
                                           super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                                           super_QFlagsStorage<QPaintEngine::DirtyFlag>.i + 1) & 1))
  ;
  if ((pQVar5[0xfc].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
       super_QFlagsStorage<QPaintEngine::DirtyFlag>.i & 0x40) == 0) {
    pQVar6 = &((brush->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
               super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
               super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl)->transform;
    pQVar7 = &QStack_88;
    for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
      *(undefined8 *)pQVar7 = pQVar6->m_matrix[0][0];
      pQVar6 = (QTransform *)((long)pQVar6 + ((ulong)bVar8 * -2 + 1) * 8);
      pQVar7 = (QTransform *)((long)pQVar7 + ((ulong)bVar8 * -2 + 1) * 8);
    }
    TVar2 = QTransform::type(&QStack_88);
    if ((int)TVar2 < 0) goto LAB_0036f23d;
  }
  this_01 = (QRasterPaintEnginePrivate *)(this->super_QPaintEngineEx).super_QPaintEngine.d_ptr.d;
  QRasterPaintEnginePrivate::brushMatrix(&QStack_88,this_00);
  QRasterPaintEnginePrivate::updateMatrixData(this_01,(QSpanData *)(pQVar5 + 0xba),brush,&QStack_88)
  ;
LAB_0036f23d:
  QBrush::operator=((QBrush *)(pQVar5 + 0xb8),brush);
  pQVar5[0xfc].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
  super_QFlagsStorage<QPaintEngine::DirtyFlag>.i = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRasterPaintEngine::updateBrush(const QBrush &brush)
{
#ifdef QT_DEBUG_DRAW
    qDebug() << "QRasterPaintEngine::updateBrush()" << brush;
#endif
    Q_D(QRasterPaintEngine);
    QRasterPaintEngineState *s = state();
    // must set clip prior to setup, as setup uses it...
    s->brushData.clip = d->clip();
    s->brushData.setup(brush, s->intOpacity, s->composition_mode, s->flags.cosmetic_brush);
    if (s->fillFlags & DirtyTransform
        || brush.transform().type() >= QTransform::TxNone)
        d_func()->updateMatrixData(&s->brushData, brush, d->brushMatrix());
    s->lastBrush = brush;
    s->fillFlags = 0;
}